

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall
re2::Prog::MarkSuccessors
          (Prog *this,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  uint uVar1;
  int i;
  pointer piVar2;
  Inst *pIVar3;
  SparseArray<int> *this_00;
  bool bVar4;
  long lVar5;
  long lVar6;
  int id;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_5c [2];
  int local_54;
  SparseSet *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  SparseArray<int> *local_40;
  Prog *local_38;
  
  local_5c[0] = (anon_union_4_5_a3ff96c3_for_Inst_2)rootmap->size_;
  SparseArray<int>::set_new(rootmap,0,&local_5c[0].cap_);
  bVar4 = SparseArray<int>::has_index(rootmap,this->start_unanchored_);
  if (!bVar4) {
    local_5c[0] = (anon_union_4_5_a3ff96c3_for_Inst_2)rootmap->size_;
    SparseArray<int>::set_new(rootmap,this->start_unanchored_,&local_5c[0].cap_);
  }
  bVar4 = SparseArray<int>::has_index(rootmap,this->start_);
  if (!bVar4) {
    local_5c[0] = (anon_union_4_5_a3ff96c3_for_Inst_2)rootmap->size_;
    SparseArray<int>::set_new(rootmap,this->start_,&local_5c[0].cap_);
  }
  reachable->size_ = 0;
  piVar2 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar2) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar2;
  }
  local_5c[0] = (anon_union_4_5_a3ff96c3_for_Inst_2)this->start_unanchored_;
  local_40 = rootmap;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(stk,&local_5c[0].cap_);
  local_50 = reachable;
  local_48 = stk;
  local_38 = this;
  do {
    piVar2 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start == piVar2) {
      return;
    }
    id = piVar2[-1];
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar2 + -1;
LAB_001b9aee:
    while( true ) {
      bVar4 = SparseSetT<void>::contains(reachable,id);
      if (bVar4) break;
      SparseSetT<void>::insert_new(reachable,id);
      this_00 = local_40;
      lVar6 = (long)id;
      pIVar3 = (local_38->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      uVar1 = pIVar3[lVar6].out_opcode_;
      switch(uVar1 & 7) {
      case 0:
      case 1:
        local_5c[0].out1_ = uVar1 >> 4;
        local_5c[1] = pIVar3[lVar6].field_1;
        for (lVar5 = 0; stk = local_48, lVar5 != 8; lVar5 = lVar5 + 4) {
          i = *(int *)((long)local_5c + lVar5);
          bVar4 = SparseArray<int>::has_index(predmap,i);
          if (!bVar4) {
            local_54 = (int)(((long)(predvec->
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(predvec->
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
            SparseArray<int>::set_new(predmap,i,&local_54);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::emplace_back<>(predvec);
          }
          std::vector<int,std::allocator<int>>::emplace_back<int&>
                    ((vector<int,std::allocator<int>> *)
                     ((predvec->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start +
                     (predmap->dense_).ptr_._M_t.
                     super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                     .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl
                     [(predmap->sparse_).ptr_._M_t.
                      super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl[i]].value_),&id);
        }
        local_5c[0] = pIVar3[lVar6].field_1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_48,&local_5c[0].cap_);
        break;
      default:
        bVar4 = SparseArray<int>::has_index(local_40,uVar1 >> 4);
        if (!bVar4) {
          local_5c[0].field_3 =
               (anon_struct_4_3_47ed7b4f_for_anon_union_4_5_a3ff96c3_for_Inst_2_3)this_00->size_;
          SparseArray<int>::set_new(this_00,pIVar3[lVar6].out_opcode_ >> 4,&local_5c[0].cap_);
        }
        break;
      case 5:
      case 7:
        goto switchD_001b9b33_caseD_5;
      case 6:
        goto switchD_001b9b33_caseD_6;
      }
      id = pIVar3[lVar6].out_opcode_ >> 4;
      reachable = local_50;
    }
switchD_001b9b33_caseD_5:
  } while( true );
switchD_001b9b33_caseD_6:
  id = uVar1 >> 4;
  goto LAB_001b9aee;
}

Assistant:

void Prog::MarkSuccessors(SparseArray<int>* rootmap,
                          SparseArray<int>* predmap,
                          std::vector<std::vector<int>>* predvec,
                          SparseSet* reachable, std::vector<int>* stk) {
  // Mark the kInstFail instruction.
  rootmap->set_new(0, rootmap->size());

  // Mark the start_unanchored and start instructions.
  if (!rootmap->has_index(start_unanchored()))
    rootmap->set_new(start_unanchored(), rootmap->size());
  if (!rootmap->has_index(start()))
    rootmap->set_new(start(), rootmap->size());

  reachable->clear();
  stk->clear();
  stk->push_back(start_unanchored());
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        // Mark this instruction as a predecessor of each out.
        for (int out : {ip->out(), ip->out1()}) {
          if (!predmap->has_index(out)) {
            predmap->set_new(out, static_cast<int>(predvec->size()));
            predvec->emplace_back();
          }
          (*predvec)[predmap->get_existing(out)].emplace_back(id);
        }
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        // Mark the out of this instruction as a "root".
        if (!rootmap->has_index(ip->out()))
          rootmap->set_new(ip->out(), rootmap->size());
        id = ip->out();
        goto Loop;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }
}